

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.h
# Opt level: O0

void __thiscall puppup::trie::Gaddag::Gaddag(Gaddag *this,istream *fin)

{
  char cVar1;
  chr cVar2;
  bool bVar3;
  reference pvVar4;
  istream *piVar5;
  ostream *this_00;
  reference pcVar6;
  size_type sVar7;
  reference pvVar8;
  size_type sVar9;
  const_reference pvVar10;
  size_type sVar11;
  reference pvVar12;
  nodeid nVar13;
  nodeid child_2;
  chr child_chr_2;
  nodeid last;
  nodeid child_1;
  chr child_chr_1;
  nodeid child;
  chr child_chr;
  nodeid node;
  nodeid n_nodes;
  chr i_2;
  idx j_1;
  chr i_1;
  idx j;
  nodeid curr;
  idx start;
  idx n;
  value_type *word;
  idx wn;
  idx w;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_158;
  char c_1;
  iterator __end3_1;
  iterator __begin3_1;
  string *__range3_1;
  char *c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  string local_110 [8];
  string s;
  long local_f0;
  idx i;
  array<long,_26UL> stridx;
  istream *fin_local;
  Gaddag *this_local;
  
  stridx._M_elems[0x19] = (long)fin;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&this->words_);
  std::vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>::vector
            (&this->nodes_);
  std::vector<long,_std::allocator<long>_>::vector(&this->node_to_word_);
  std::vector<long,_std::allocator<long>_>::vector(&this->next_sibling_);
  std::vector<long,_std::allocator<long>_>::vector(&this->first_child_);
  std::vector<long,_std::allocator<long>_>::vector(&this->val_);
  for (local_f0 = 0; local_f0 < 0x1a; local_f0 = local_f0 + 1) {
    pvVar4 = std::array<long,_26UL>::operator[]
                       ((array<long,_26UL> *)&i,
                        (long)("eiaontrsuldgywvpmhfcbzxqkj_    +"[local_f0] + -0x61));
    *pvVar4 = local_f0;
  }
  std::__cxx11::string::string(local_110);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::reserve(&this->words_,200000);
  do {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)stridx._M_elems[0x19],local_110);
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar3) {
      sVar7 = std::
              vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ::size(&this->words_);
      std::vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>::reserve
                (&this->nodes_,sVar7 * 5);
      std::vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>::
      emplace_back<>(&this->nodes_);
      sVar7 = std::
              vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ::size(&this->words_);
      std::vector<long,_std::allocator<long>_>::reserve(&this->node_to_word_,sVar7 * 5);
      wn = 0;
      sVar7 = std::
              vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ::size(&this->words_);
      for (; wn < (long)sVar7; wn = wn + 1) {
        pvVar8 = std::
                 vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ::operator[](&this->words_,wn);
        sVar9 = std::vector<long,_std::allocator<long>_>::size(pvVar8);
        for (curr = -1; curr < (long)sVar9; curr = curr + 1) {
          j = 0;
          for (i_1 = curr; -1 < i_1; i_1 = i_1 + -1) {
            pvVar10 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,i_1);
            cVar2 = *pvVar10;
            add(this,j,cVar2);
            j = get(this,j,cVar2);
          }
          add(this,j,0x1f);
          j = get(this,j,0x1f);
          i_2 = curr;
          while (i_2 = i_2 + 1, i_2 < (long)sVar9) {
            pvVar10 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,i_2);
            cVar2 = *pvVar10;
            add(this,j,cVar2);
            j = get(this,j,cVar2);
          }
          while (sVar11 = std::vector<long,_std::allocator<long>_>::size(&this->node_to_word_),
                (long)sVar11 <= j) {
            std::vector<long,_std::allocator<long>_>::push_back(&this->node_to_word_,&invalid);
          }
          pvVar12 = std::vector<long,_std::allocator<long>_>::operator[](&this->node_to_word_,j);
          *pvVar12 = wn;
        }
      }
      sVar7 = std::vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>::
              size(&this->nodes_);
      std::vector<long,_std::allocator<long>_>::resize(&this->next_sibling_,sVar7);
      std::vector<long,_std::allocator<long>_>::resize(&this->first_child_,sVar7);
      std::vector<long,_std::allocator<long>_>::resize(&this->val_,sVar7);
      child_chr = 0;
      do {
        if ((long)sVar7 <= child_chr) {
          std::__cxx11::string::~string(local_110);
          return;
        }
        for (child = 0; child < 0x20; child = child + 1) {
          sVar9 = get(this,child_chr,child);
          if (sVar9 != 0xffffffffffffffff) {
            pvVar12 = std::vector<long,_std::allocator<long>_>::operator[](&this->val_,sVar9);
            *pvVar12 = child;
          }
        }
        for (child_1 = 0; child_1 < 0x20; child_1 = child_1 + 1) {
          nVar13 = get(this,child_chr,child_1);
          if (nVar13 != -1) {
            pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                                (&this->first_child_,child_chr);
            *pvVar12 = nVar13;
            break;
          }
        }
        child_chr_2 = -1;
        for (child_2 = 0; child_2 < 0x20; child_2 = child_2 + 1) {
          nVar13 = get(this,child_chr,child_2);
          cVar2 = child_chr_2;
          if ((nVar13 != -1) && (cVar2 = nVar13, child_chr_2 != -1)) {
            pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                                (&this->next_sibling_,child_chr_2);
            *pvVar12 = nVar13;
          }
          child_chr_2 = cVar2;
        }
        if (child_chr_2 == -1) {
          pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                              (&this->first_child_,child_chr);
          *pvVar12 = -1;
        }
        else {
          pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                              (&this->next_sibling_,child_chr_2);
          *pvVar12 = -1;
        }
        child_chr = child_chr + 1;
      } while( true );
    }
    __end3._M_current = (char *)std::__cxx11::string::begin();
    c = (char *)std::__cxx11::string::end();
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), bVar3) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end3);
      if (('@' < *pcVar6) && (*pcVar6 < '[')) {
        *pcVar6 = *pcVar6 + ' ';
      }
      if ((*pcVar6 < 'a') || ('z' < *pcVar6)) {
        this_00 = std::operator<<((ostream *)&std::cerr,local_110);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        break;
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::emplace_back<>(&this->words_);
    pvVar8 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::back(&this->words_);
    sVar7 = std::__cxx11::string::length();
    std::vector<long,_std::allocator<long>_>::reserve(pvVar8,sVar7);
    __end3_1._M_current = (char *)std::__cxx11::string::begin();
    _Stack_158._M_current = (char *)std::__cxx11::string::end();
    while (bVar3 = __gnu_cxx::operator!=(&__end3_1,&stack0xfffffffffffffea8), bVar3) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end3_1);
      cVar1 = *pcVar6;
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::back(&this->words_);
      pvVar4 = std::array<long,_26UL>::operator[]((array<long,_26UL> *)&i,(long)(cVar1 + -0x61));
      std::vector<long,_std::allocator<long>_>::push_back(pvVar8,pvVar4);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3_1);
    }
  } while( true );
}

Assistant:

explicit Gaddag(std::istream& fin) {
        std::array<idx, 26> stridx;
        for (idx i = 0; i < 26; ++i) {
            stridx[idxstr[i] - 'a'] = i;
        }
        std::string s;
        words_.reserve(200'000);
        while (std::getline(fin, s)) {
            for (char& c : s) {
                if (c >= 'A' && c <= 'Z') {
                    c += 'a' - 'A';
                }
                if (c < 'a' || c > 'z') {
                    std::cerr << s << std::endl;
                    break;
                }
            }
            words_.emplace_back();
            words_.back().reserve(s.length());
            for (char c : s) {
                words_.back().push_back(stridx[c - 'a']);
            }
        }
        nodes_.reserve(5 * words_.size());
        nodes_.emplace_back();  // root
        node_to_word_.reserve(5 * words_.size());
        for (idx w = 0, wn = words_.size(); w < wn; ++w) {
            const auto& word = words_[w];
            const idx n = word.size();
            for (idx start = -1; start < n; ++start) {
                nodeid curr = 0;
                for (idx j = start; j >= 0; --j) {
                    const chr i = word[j];
                    add(curr, i);
                    curr = get(curr, i);
                }
                add(curr, rev_marker);
                curr = get(curr, rev_marker);
                for (idx j = start + 1; j < n; ++j) {
                    const chr i = word[j];
                    add(curr, i);
                    curr = get(curr, i);
                }
                while (curr >= idx(node_to_word_.size())) {
                    node_to_word_.push_back(invalid);
                }
                node_to_word_[curr] = w;
            }
        }
        const nodeid n_nodes = nodes_.size();
        next_sibling_.resize(n_nodes);
        first_child_.resize(n_nodes);
        val_.resize(n_nodes);
        for (nodeid node = 0; node < n_nodes; ++node) {
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    val_[child] = child_chr;
                }
            }
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    first_child_[node] = child;
                    break;
                }
            }
            nodeid last = invalid;
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    if (last != invalid) {
                        next_sibling_[last] = child;
                    }
                    last = child;
                }
            }
            if (last != invalid) {
                next_sibling_[last] = invalid;
            } else {
                first_child_[node] = invalid;
            }
        }
    }